

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_descriptor_set_layouts
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *layouts)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  ulonglong uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  ConstMemberIterator CVar5;
  Ch *pCVar6;
  const_iterator cVar7;
  Type pGVar8;
  Number NVar9;
  ulong uVar10;
  Pointer this_01;
  size_t size;
  Hash hash;
  ulonglong local_58;
  Data local_50;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  DatabaseInterface *local_38;
  
  local_38 = resolver;
  if ((layouts->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x49a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::MemberCount() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar10 = (ulong)(layouts->data_).s.length;
  if (uVar10 == 0) {
    local_50.s.str = (Ch *)0x0;
  }
  else {
    size = uVar10 << 5;
    local_50.s.str = (Ch *)ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (local_50.s.str != (Ch *)0x0) {
      memset(local_50.s.str,0,size);
    }
    if ((layouts->data_).f.flags != 3) {
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x4d8,
                    "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  this_01 = (Pointer)((ulong)(layouts->data_).s.str & 0xffffffffffff);
  CVar5 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(layouts);
  if (CVar5.ptr_ != this_01) {
    local_40 = &(this->replayed_descriptor_set_layouts)._M_h;
    uVar10 = 0;
    do {
      pCVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&this_01->name);
      local_58 = strtoull(pCVar6,(char **)0x0,0x10);
      cVar7 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_40,&local_58);
      uVar2 = local_50.s.str;
      if (cVar7.
          super__Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        this_00 = &this_01->value;
        pCVar6 = local_50.s.str + uVar10 * 0x20;
        pCVar6[0] = ' ';
        pCVar6[1] = '\0';
        pCVar6[2] = '\0';
        pCVar6[3] = '\0';
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"flags");
        if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) {
          __assert_fail("data_.f.flags & kUintFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x719,
                        "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        pCVar6 = (Ch *)(uVar2 + uVar10 * 0x20);
        *(SizeType *)(pCVar6 + 0x10) = (pGVar8->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_50.s,(Ch *)this_00);
        uVar2 = local_50.n;
        NVar9.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        if (uVar2 != NVar9.i64) {
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"bindings");
          if ((pGVar8->data_).f.flags != 4) {
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x66a,
                          "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          *(SizeType *)(pCVar6 + 0x14) = (pGVar8->data_).s.length;
          bVar3 = parse_descriptor_set_bindings
                            (this,iface,local_38,pGVar8,
                             (VkDescriptorSetLayoutBinding **)(pCVar6 + 0x18));
          if (!bVar3) {
            return false;
          }
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_50.s,(Ch *)this_00);
        uVar2 = local_50.n;
        NVar9.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this_00);
        if (uVar2 != NVar9.i64) {
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"pNext");
          bVar3 = parse_pnext_chain(this,pGVar8,(void **)(pCVar6 + 8),(StateCreatorInterface *)0x0,
                                    (DatabaseInterface *)0x0,(Value *)0x0);
          if (!bVar3) {
            return false;
          }
        }
        uVar1 = local_58;
        std::__detail::
        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)local_40,&local_58);
        iVar4 = (*iface->_vptr_StateCreatorInterface[6])(iface,uVar1,pCVar6);
        if ((char)iVar4 == '\0') {
          return false;
        }
      }
      this_01 = this_01 + 1;
      uVar10 = (ulong)((int)uVar10 + 1);
      CVar5 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd(layouts);
    } while (this_01 != CVar5.ptr_);
  }
  (*iface->_vptr_StateCreatorInterface[0x11])();
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_descriptor_set_layouts(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &layouts)
{
	auto *infos = allocator.allocate_n_cleared<VkDescriptorSetLayoutCreateInfo>(layouts.MemberCount());

	unsigned index = 0;
	for (auto itr = layouts.MemberBegin(); itr != layouts.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_descriptor_set_layouts.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;

		info.flags = obj["flags"].GetUint();
		if (obj.HasMember("bindings"))
		{
			auto &bindings = obj["bindings"];
			info.bindingCount = bindings.Size();
			if (!parse_descriptor_set_bindings(iface, resolver, bindings, &info.pBindings))
				return false;
		}

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &info.pNext))
				return false;

		if (!iface.enqueue_create_descriptor_set_layout(hash, &info, &replayed_descriptor_set_layouts[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}